

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O2

bool __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::emplace(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
         basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,size_t size)

{
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>
  _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  pVar2;
  size_t local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  size_t *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_20 = &local_30;
  local_30 = size;
  local_28 = k;
  local_18 = v;
  pVar2 = ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::__cxx11::string&&,unsigned_long&>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUMap<std::__cxx11::string,std::__cxx11::string>::Item>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->items,&::std::piecewise_construct,&local_28);
  _Var1 = pVar2.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
          ._M_cur;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    *(long *)((long)_Var1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                    ._M_cur + 0x38) =
         (long)_Var1.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
               ._M_cur + 8;
    *(size_t *)
     ((long)_Var1.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
            ._M_cur + 0x60) = local_30;
    this->total_size = this->total_size + local_30;
    link_item(this,(Item *)((long)_Var1.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
                                  ._M_cur + 0x28));
  }
  return (bool)(pVar2.second & 1);
}

Assistant:

bool emplace(KeyT&& k, ValueT&& v, size_t size = 1) {
    auto emplace_ret = this->items.emplace(std::piecewise_construct,
        std::forward_as_tuple(std::move(k)),
        std::forward_as_tuple(std::move(v), size));

    if (emplace_ret.second) {
      // Item was inserted; set the key pointer, link the item and update the
      // total size appropriately.
      auto& i = emplace_ret.first->second;
      i.key = &emplace_ret.first->first;
      i.size = size;
      this->total_size += size;
      this->link_item(&i);
      return true;
    } else {
      return false;
    }
  }